

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

void __thiscall
xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
AddEdge(Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *this,
       StateExample sstate,StateExample dstate,double trans)

{
  bool bVar1;
  StateExample dst_state;
  edge_iterator __args;
  pointer pEVar2;
  ostream *poVar3;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  this_00;
  list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>
  *in_RDX;
  Vertex *in_RSI;
  double in_XMM0_Qa;
  vertex_iterator dst_vertex;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>
  *in_stack_00000020;
  StateExample in_stack_00000028;
  edge_iterator it;
  vertex_iterator src_vertex;
  Vertex *in_stack_ffffffffffffff98;
  double dVar4;
  list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>
  *this_01;
  _Self local_38;
  
  dst_state.id = (int64_t)ObtainVertexFromVertexMap(in_stack_00000020,in_stack_00000028);
  vertex_iterator::operator->((vertex_iterator *)0x104fa6);
  this_01 = in_RDX;
  local_38._M_node =
       (_List_node_base *)Vertex::FindEdge<xmotion::StateExample,_nullptr>(in_RSI,dst_state);
  vertex_iterator::operator->((vertex_iterator *)0x104fcc);
  __args = Vertex::edge_end(in_stack_ffffffffffffff98);
  bVar1 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffffb8);
  if (bVar1) {
    dVar4 = in_XMM0_Qa;
    pEVar2 = std::
             _List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>
             ::operator->((_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>
                           *)0x105003);
    pEVar2->cost = dVar4;
    poVar3 = std::operator<<((ostream *)&std::cout,"updated cost: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_XMM0_Qa);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    this_00._M_cur = (__node_type *)ObtainVertexFromVertexMap(in_stack_00000020,in_stack_00000028);
    vertex_iterator::operator->((vertex_iterator *)0x105067);
    std::__cxx11::
    list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator>_>
    ::push_back((list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator>_>
                 *)this_00._M_cur,(value_type *)in_RDX);
    vertex_iterator::operator->((vertex_iterator *)0x105082);
    std::__cxx11::
    list<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Edge,std::allocator<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Edge>>
    ::
    emplace_back<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::vertex_iterator&,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::vertex_iterator&,double&>
              (this_01,(vertex_iterator *)__args._M_node,(vertex_iterator *)this_00._M_cur,
               (double *)in_RDX);
  }
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}